

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O1

exr_result_t
exr_read_scanline_chunk_info
          (exr_const_context_t_conflict ctxt,int part_index,int y,exr_chunk_info_t *cinfo)

{
  exr_storage_t eVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  exr_const_priv_part_t part;
  ulong uVar5;
  bool bVar6;
  exr_result_t eVar7;
  int iVar8;
  uint uVar9;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE_00;
  uint64_t uVar10;
  ulong uVar11;
  char *pcVar12;
  exr_const_priv_part_t part_00;
  uint x;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  uint uVar13;
  uint64_t dataoff;
  uint64_t chunkmin;
  int32_t data [3];
  uint64_t *ctable;
  int64_t ddata [3];
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar15;
  undefined8 uVar14;
  ulong local_80;
  int local_74;
  ulong local_70;
  ulong local_68;
  uint local_5c [3];
  uint64_t *local_50;
  uint64_t local_48;
  ulong local_40;
  ulong local_38;
  
  uVar15 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    return 2;
  }
  if (ctxt->mode != '\0') {
    UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
    eVar7 = 7;
LAB_0012b5a9:
    eVar7 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,eVar7);
    return eVar7;
  }
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    eVar7 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar7;
  }
  if (cinfo == (exr_chunk_info_t *)0x0) {
    UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
    eVar7 = 3;
    goto LAB_0012b5a9;
  }
  part = ctxt->parts[(uint)part_index];
  eVar1 = part->storage_mode;
  if ((eVar1 & ~EXR_STORAGE_DEEP_SCANLINE) != EXR_STORAGE_SCANLINE) {
    UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
    eVar7 = 0x12;
    goto LAB_0012b5a9;
  }
  uVar9 = (part->data_window).min.y;
  uVar2 = (part->data_window).max.y;
  uVar13 = y - uVar9;
  if ((int)uVar2 < y || y < (int)uVar9) {
    UNRECOVERED_JUMPTABLE = ctxt->print_error;
    pcVar12 = "Invalid request for scanline %d outside range of data window (%d - %d)";
    uVar13 = uVar9;
LAB_0012b73b:
    eVar7 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar12,(ulong)(uint)y,(ulong)uVar13,(ulong)uVar2);
    return eVar7;
  }
  iVar3 = (part->data_window).min.x;
  iVar4 = (part->data_window).max.x;
  local_74 = (int)part->lines_per_chunk;
  if (1 < local_74) {
    uVar13 = (int)uVar13 / local_74;
  }
  if (((int)uVar13 < 0) || (part->chunk_count <= (int)uVar13)) {
    UNRECOVERED_JUMPTABLE = ctxt->print_error;
    uVar2 = part->chunk_count;
    pcVar12 = "Invalid request for scanline %d in chunk %d outside chunk count %d";
    goto LAB_0012b73b;
  }
  iVar8 = uVar13 * local_74;
  x = iVar8 + uVar9;
  cinfo->idx = uVar13;
  cinfo->type = (uint8_t)eVar1;
  cinfo->compression = (char)part->comp_type;
  cinfo->start_x = iVar3;
  cinfo->start_y = x;
  cinfo->width = (iVar4 - iVar3) + 1;
  cinfo->height = local_74;
  if (iVar8 < 0) {
    cinfo->start_y = uVar9;
    iVar8 = iVar8 + local_74;
LAB_0012b755:
    cinfo->height = iVar8;
  }
  else if ((long)(int)uVar2 < (long)local_74 + (long)(int)x) {
    iVar8 = (uVar2 - x) + 1;
    goto LAB_0012b755;
  }
  cinfo->level_x = '\0';
  cinfo->level_y = '\0';
  eVar7 = extract_chunk_table(ctxt,part,&local_50,&local_68);
  if (eVar7 != 0) {
    return eVar7;
  }
  uVar5 = ctxt->file_size;
  local_80 = local_50[uVar13];
  if (local_80 == 0) {
    return 0x18;
  }
  if ((local_80 < local_68) || ((0 < (long)uVar5 && (uVar5 < local_80)))) {
    eVar7 = (*ctxt->print_error)
                      (ctxt,0x16,
                       "Corrupt chunk offset table: scanline %d, chunk index %d recorded at file offset %lu"
                       ,(ulong)(uint)y,(ulong)uVar13);
    return eVar7;
  }
  local_70 = 0;
  eVar7 = (*ctxt->do_read)(ctxt,local_5c,
                           (ulong)(((uint)(part->storage_mode != EXR_STORAGE_DEEP_SCANLINE) -
                                   (uint)(ctxt->is_multipart == '\0')) * 4 + 8),&local_80,
                           (int64_t *)0x0,EXR_MUST_READ_ALL);
  if (eVar7 != 0) {
    return eVar7;
  }
  if (ctxt->is_multipart != '\0') {
    part_00 = (exr_const_priv_part_t)(ulong)local_5c[0];
    local_70 = 1;
    if (local_5c[0] != part_index) {
      uVar14 = CONCAT44(uVar15,part_index);
      pcVar12 = 
      "Preparing read scanline %d (chunk %d), found corrupt leader: part says %d, expected %d";
      goto LAB_0012b8e3;
    }
  }
  uVar11 = local_70 & 0xffffffff;
  part_00 = (exr_const_priv_part_t)(ulong)local_5c[uVar11];
  if (x != local_5c[uVar11]) {
    uVar14 = CONCAT44(uVar15,x);
    pcVar12 = 
    "Preparing to read scanline %d (chunk %d), found corrupt leader: scanline says %d, expected %d";
LAB_0012b8e3:
    eVar7 = (*ctxt->print_error)(ctxt,0x16,pcVar12,(ulong)(uint)y,(ulong)uVar13,part_00,uVar14);
    return eVar7;
  }
  if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE) {
    eVar7 = (*ctxt->do_read)(ctxt,&local_48,0x18,&local_80,(int64_t *)0x0,EXR_MUST_READ_ALL);
    if (eVar7 != 0) {
      return eVar7;
    }
    if ((long)local_48 < 0) {
      pcVar12 = 
      "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid sample table size %ld"
      ;
      local_40 = local_48;
LAB_0012ba0c:
      eVar7 = (*ctxt->print_error)(ctxt,0x16,pcVar12,(ulong)(uint)y,(ulong)uVar13,local_40);
      return eVar7;
    }
    if ((local_40 & 0xffffffff80000000) != 0) {
      pcVar12 = 
      "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid packed data size %ld"
      ;
      goto LAB_0012ba0c;
    }
    if ((local_38 & 0xffffffff80000000) != 0) {
      pcVar12 = 
      "Preparing to scanline %d (chunk %d), found corrupt leader: unsupported unpacked data size %ld"
      ;
      local_40 = local_38;
      goto LAB_0012ba0c;
    }
    cinfo->sample_count_data_offset = local_80;
    cinfo->sample_count_table_size = local_48;
    uVar11 = local_80 + local_48;
    cinfo->data_offset = uVar11;
    cinfo->packed_size = local_40;
    cinfo->unpacked_size = local_38;
    local_68 = (long)cinfo->height * (long)cinfo->width * 4;
    if ((part->comp_type == EXR_COMPRESSION_NONE) && (local_48 != local_68)) {
      eVar7 = (*ctxt->print_error)
                        (ctxt,0x16,
                         "Invalid deep sample count size, must be one entry per pixel: found %lu expected %lu"
                         ,local_48);
      return eVar7;
    }
    if ((0 < (long)uVar5) && (uVar5 < uVar11 || uVar5 < uVar11 + local_40)) {
      pcVar12 = 
      "Preparing to scanline %d (chunk %d), found corrupt leader: sample table and data result in access past end of the file: sample table size %ld + data size %ld larger than file %ld"
      ;
      local_40 = local_48;
      goto LAB_0012ba0c;
    }
    goto LAB_0012b957;
  }
  uVar10 = compute_chunk_unpack_size(x,cinfo->width,cinfo->height,local_74,(int)part,part_00);
  uVar11 = (ulong)(int)local_5c[uVar11 + 1];
  if (((long)uVar11 < 0) || (part->unpacked_size_per_chunk < uVar11)) {
    pcVar12 = 
    "Preparing to read scanline %d (chunk %d), found corrupt leader: packed data size says %lu, must be between 0 and %lu"
    ;
    uVar10 = part->unpacked_size_per_chunk;
LAB_0012b939:
    bVar6 = false;
    uVar9 = (*ctxt->print_error)(ctxt,0x16,pcVar12,(ulong)(uint)y,(ulong)uVar13,uVar11,uVar10);
    uVar10 = (uint64_t)uVar9;
  }
  else {
    cinfo->data_offset = local_80;
    cinfo->packed_size = uVar11;
    cinfo->unpacked_size = uVar10;
    cinfo->sample_count_data_offset = 0;
    cinfo->sample_count_table_size = 0;
    bVar6 = true;
    if ((0 < (long)uVar5) && (uVar5 < uVar11 + local_80)) {
      pcVar12 = 
      "Preparing to read scanline %d (chunk %d), found corrupt leader: packed size %lu, file offset %lu, size %ld"
      ;
      uVar10 = local_80;
      goto LAB_0012b939;
    }
  }
  if (!bVar6) {
    return (exr_result_t)uVar10;
  }
LAB_0012b957:
  if (cinfo->packed_size != 0) {
    return 0;
  }
  if (cinfo->unpacked_size == 0) {
    return 0;
  }
  eVar7 = (*ctxt->report_error)(ctxt,3,"Invalid packed size of 0");
  return eVar7;
}

Assistant:

exr_result_t
exr_read_scanline_chunk_info (
    exr_const_context_t ctxt, int part_index, int y, exr_chunk_info_t* cinfo)
{
    exr_result_t     rv;
    int              miny, cidx, rdcnt, lpc;
    int32_t          data[3];
    int64_t          ddata[3];
    int64_t          fsize;
    uint64_t         chunkmin, dataoff;
    exr_attr_box2i_t dw;
    uint64_t*        ctable;

    EXR_READONLY_AND_DEFINE_PART (part_index);

    if (!cinfo) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    if (part->storage_mode != EXR_STORAGE_SCANLINE &&
        part->storage_mode != EXR_STORAGE_DEEP_SCANLINE)
    {
        return ctxt->standard_error (ctxt, EXR_ERR_SCAN_TILE_MIXEDAPI);
    }

    dw = part->data_window;
    if (y < dw.min.y || y > dw.max.y)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d outside range of data window (%d - %d)",
            y,
            dw.min.y,
            dw.max.y);
    }

    lpc  = part->lines_per_chunk;
    cidx = y - dw.min.y;
    if (lpc > 1) cidx /= lpc;

    // do we need to invert this when reading decreasing y? it appears not
    //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
    //    cidx = part->chunk_count - (cidx + 1);
    miny = dw.min.y + cidx * lpc;

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for scanline %d in chunk %d outside chunk count %d",
            y,
            cidx,
            part->chunk_count);
    }

    cinfo->idx         = cidx;
    cinfo->type        = (uint8_t) part->storage_mode;
    cinfo->compression = (uint8_t) part->comp_type;
    cinfo->start_x     = dw.min.x;
    cinfo->start_y     = miny;
    cinfo->width       = dw.max.x - dw.min.x + 1;
    cinfo->height      = lpc;
    if (miny < dw.min.y)
    {
        cinfo->start_y = dw.min.y;
        cinfo->height -= dw.min.y - miny;
    }
    else if (((int64_t)miny + (int64_t)lpc) > (int64_t)dw.max.y)
    {
        cinfo->height = dw.max.y - miny + 1;
    }
    cinfo->level_x = 0;
    cinfo->level_y = 0;

    /* need to read from the file to get the packed chunk size */
    rv = extract_chunk_table (ctxt, part, &ctable, &chunkmin);
    if (rv != EXR_ERR_SUCCESS) return rv;

    fsize = ctxt->file_size;

    dataoff = ctable[cidx];

    /* known behavior for partial files */
    if (dataoff == 0)
        return EXR_ERR_INCOMPLETE_CHUNK_TABLE;

    if (dataoff < chunkmin || (fsize > 0 && dataoff > (uint64_t) fsize))
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_BAD_CHUNK_LEADER,
            "Corrupt chunk offset table: scanline %d, chunk index %d recorded at file offset %" PRIu64,
            y,
            cidx,
            dataoff);
    }

    /* TODO: Look at collapsing this into extract_chunk_leader, only
     * issue is more concrete error messages */
    /* multi part files have the part for validation */
    rdcnt = (ctxt->is_multipart) ? 2 : 1;
    /* deep has 64-bit data, so be variable about what we read */
    if (part->storage_mode != EXR_STORAGE_DEEP_SCANLINE) ++rdcnt;

    rv = ctxt->do_read (
        ctxt,
        data,
        (size_t) (rdcnt) * sizeof (int32_t),
        &dataoff,
        NULL,
        EXR_MUST_READ_ALL);

    if (rv != EXR_ERR_SUCCESS) return rv;

    priv_to_native32 (data, rdcnt);

    rdcnt = 0;
    if (ctxt->is_multipart)
    {
        if (data[rdcnt] != part_index)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing read scanline %d (chunk %d), found corrupt leader: part says %d, expected %d",
                y,
                cidx,
                data[rdcnt],
                part_index);
        }
        ++rdcnt;
    }
    if (miny != data[rdcnt])
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_BAD_CHUNK_LEADER,
            "Preparing to read scanline %d (chunk %d), found corrupt leader: scanline says %d, expected %d",
            y,
            cidx,
            data[rdcnt],
            miny);
    }

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        rv = ctxt->do_read (
            ctxt,
            ddata,
            3 * sizeof (int64_t),
            &dataoff,
            NULL,
            EXR_MUST_READ_ALL);
        if (rv != EXR_ERR_SUCCESS) { return rv; }
        priv_to_native64 (ddata, 3);

        if (ddata[0] < 0)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid sample table size %" PRId64,
                y,
                cidx,
                ddata[0]);
        }
        if (ddata[1] < 0 || ddata[1] > (int64_t) INT_MAX)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: invalid packed data size %" PRId64,
                y,
                cidx,
                ddata[1]);
        }
        if (ddata[2] < 0 || ddata[2] > (int64_t) INT_MAX)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to scanline %d (chunk %d), found corrupt leader: unsupported unpacked data size %" PRId64,
                y,
                cidx,
                ddata[2]);
        }

        cinfo->sample_count_data_offset = dataoff;
        cinfo->sample_count_table_size  = (uint64_t) ddata[0];
        cinfo->data_offset              = dataoff + (uint64_t) ddata[0];
        cinfo->packed_size              = (uint64_t) ddata[1];
        cinfo->unpacked_size            = (uint64_t) ddata[2];

        /*
         * uncompressed reads don't have same checks as compressed, so
         * pre-check that the data is of a valid size
         */
        chunkmin = ((uint64_t)cinfo->width * (uint64_t)cinfo->height) * sizeof(int32_t);
        if (part->comp_type == EXR_COMPRESSION_NONE &&
            cinfo->sample_count_table_size != chunkmin)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Invalid deep sample count size, must be one entry per pixel: found %" PRIu64 " expected %" PRIu64,
                cinfo->sample_count_table_size, chunkmin);
        }

        if (fsize > 0 &&
            ((cinfo->sample_count_data_offset +
              cinfo->sample_count_table_size) > ((uint64_t) fsize) ||
             (cinfo->data_offset + cinfo->packed_size) > ((uint64_t) fsize)))
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to scanline %d (chunk %d), found corrupt leader: sample table and data result in access past end of the file: sample table size %" PRId64
                " + data size %" PRId64 " larger than file %" PRId64,
                y,
                cidx,
                ddata[0],
                ddata[1],
                fsize);
        }
    }
    else
    {
        uint64_t unpacksize = compute_chunk_unpack_size (
            dw.min.x, miny, cinfo->width, cinfo->height, lpc, part);

        ++rdcnt;
        if (data[rdcnt] < 0 ||
            (uint64_t) data[rdcnt] > part->unpacked_size_per_chunk)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: packed data size says %" PRIu64
                ", must be between 0 and %" PRIu64,
                y,
                cidx,
                (uint64_t) data[rdcnt],
                part->unpacked_size_per_chunk);
        }

        cinfo->data_offset              = dataoff;
        cinfo->packed_size              = (uint64_t) data[rdcnt];
        cinfo->unpacked_size            = unpacksize;
        cinfo->sample_count_data_offset = 0;
        cinfo->sample_count_table_size  = 0;

        if (fsize > 0 &&
            (cinfo->data_offset + cinfo->packed_size) > ((uint64_t) fsize))
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Preparing to read scanline %d (chunk %d), found corrupt leader: packed size %" PRIu64
                ", file offset %" PRIu64 ", size %" PRId64,
                y,
                cidx,
                cinfo->packed_size,
                cinfo->data_offset,
                fsize);
        }
    }

    if (cinfo->packed_size == 0 && cinfo->unpacked_size > 0)
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid packed size of 0");
    return EXR_ERR_SUCCESS;
}